

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

void __thiscall ot::commissioner::TokenManager::~TokenManager(TokenManager *this)

{
  TokenManager *this_local;
  
  mbedtls_entropy_free((mbedtls_entropy_context *)&this->mEntropy);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)&this->mCtrDrbg);
  mbedtls_pk_free((mbedtls_pk_context_conflict *)&this->mPrivateKey);
  mbedtls_pk_free((mbedtls_pk_context_conflict *)&this->mPublicKey);
  mbedtls_pk_free((mbedtls_pk_context_conflict *)&this->mDomainCAPublicKey);
  coap::CoapSecure::~CoapSecure(&this->mRegistrarClient);
  std::__cxx11::string::~string((string *)&this->mDomainName);
  std::__cxx11::string::~string((string *)&this->mCommissionerId);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->mSignedToken);
  return;
}

Assistant:

TokenManager::~TokenManager()
{
    mbedtls_entropy_free(&mEntropy);
    mbedtls_ctr_drbg_free(&mCtrDrbg);
    mbedtls_pk_free(&mPrivateKey);
    mbedtls_pk_free(&mPublicKey);
    mbedtls_pk_free(&mDomainCAPublicKey);
}